

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToXml.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  Type TVar2;
  Entry *pEVar3;
  Writer *pWVar4;
  char *pcVar5;
  Error *pEVar6;
  int iVar7;
  pointer pTVar8;
  int code;
  long lVar9;
  FilePath indexPath;
  BatchResultTotals totals;
  CommandLine cmdLine;
  Writer writer;
  Parser parser;
  ofstream out;
  ResultToSingleXmlLogHandler handler;
  TestLogParser parser_1;
  allocator<char> local_8d9;
  string local_8d8;
  Attribute local_8b8;
  vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> local_878;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  char *local_840;
  undefined8 local_838;
  char local_830;
  undefined7 uStack_82f;
  char *local_820;
  undefined8 local_818;
  char local_810;
  undefined7 uStack_80f;
  int local_800;
  FilePath local_7f8;
  undefined1 local_7d8 [8];
  pointer local_7d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  undefined1 local_7a8 [8];
  pointer pbStack_7a0;
  pointer local_798;
  undefined1 local_658 [16];
  undefined1 local_648 [72];
  pointer local_600;
  pointer local_5f8;
  ios_base local_5e8 [264];
  undefined1 local_4e0 [8];
  char *local_4d8;
  undefined1 local_4d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  NamedValue<OutputMode> *local_4b0;
  pointer_____offset_0x10___ *local_4a8;
  undefined1 local_4a0 [16];
  SetDefaultFunc local_490;
  ios_base local_3e8 [264];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [304];
  undefined1 local_1a0 [16];
  _Alloc_hider local_190;
  _Base_ptr local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [21];
  
  local_840 = &local_830;
  local_838 = 0;
  local_830 = '\0';
  local_820 = &local_810;
  local_818 = 0;
  local_810 = '\0';
  local_800 = 1;
  de::cmdline::detail::Parser::Parser((Parser *)local_658);
  de::cmdline::detail::TypedFieldMap::TypedFieldMap((TypedFieldMap *)local_7d8);
  local_7a8 = (undefined1  [8])0x0;
  pbStack_7a0 = (pointer)0x0;
  local_798 = (pointer)0x0;
  local_490 = (SetDefaultFunc)0x0;
  local_4e0 = (undefined1  [8])0x12c9d2;
  local_4d8 = "mode";
  local_4d0._0_8_ = "Output mode";
  local_4d0._8_8_ = "single";
  local_4c0._M_local_buf[0] = false;
  local_4c0._8_8_ = (GenericParseFunc)0x0;
  local_4b0 = opt::registerOptions::s_modes;
  local_4a8 = &opt::OutMode::typeinfo;
  local_4a0._0_8_ = 0x10;
  local_4a0._8_8_ = de::cmdline::detail::Parser::dispatchParse<opt::OutMode>;
  de::cmdline::detail::Parser::addOption((Parser *)local_658,(OptInfo *)local_4e0);
  bVar1 = de::cmdline::detail::Parser::parse
                    ((Parser *)local_658,argc + -1,argv + 1,(CommandLine *)local_7d8,
                     (ostream *)&std::cerr);
  if ((bVar1) && ((long)pbStack_7a0 - (long)local_7a8 == 0x40)) {
    pEVar3 = de::cmdline::detail::TypedFieldMap::get
                       ((TypedFieldMap *)local_7d8,(type_info *)&opt::OutMode::typeinfo);
    local_800 = *pEVar3->value;
    std::__cxx11::string::_M_assign((string *)&local_840);
    std::__cxx11::string::_M_assign((string *)&local_820);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_7a8);
    de::cmdline::detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_7d8);
    de::cmdline::detail::Parser::~Parser((Parser *)local_658);
    __s = local_820;
    pcVar5 = local_840;
    if (local_800 == 1) {
      std::ofstream::ofstream(local_4e0,local_820,_S_bin);
      xe::xml::Writer::Writer((Writer *)local_7d8,(ostream *)local_4e0);
      local_2d0._0_8_ = &local_878;
      local_858 = 0;
      uStack_850 = 0;
      local_878.
      super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uStack_860 = 0;
      local_878.
      super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_878.
      super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_848 = 0;
      local_2e0._0_8_ = &PTR__ResultToSingleXmlLogHandler_00136b98;
      local_2e0._8_8_ = (Writer *)local_7d8;
      xe::TestResultParser::TestResultParser((TestResultParser *)(local_2d0 + 8));
      xe::TestLogParser::TestLogParser((TestLogParser *)local_1a0,(TestLogHandler *)local_2e0);
      if (*(int *)((long)&local_4c0 + *(long *)((long)local_4e0 + -0x18)) != 0) {
        pEVar6 = (Error *)__cxa_allocate_exception(0x10);
        xe::Error::Error(pEVar6,(char *)0x0,"out.good()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeBatchResultToXml.cpp"
                         ,0xd1);
        __cxa_throw(pEVar6,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4e0,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4e0,"<?xml-stylesheet href=\"",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"testlog.xsl",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4e0,"\" type=\"text/xsl\"?>\n",0x14);
      local_8b8.name._M_dataplus._M_p = (pointer)&local_8b8.name.field_2;
      local_8b8.name.field_2._M_allocated_capacity._0_7_ = 0x65526863746142;
      local_8b8.name.field_2._7_4_ = 0x746c7573;
      local_8b8.name._M_string_length = 0xb;
      local_8b8.name.field_2._M_local_buf[0xb] = '\0';
      pWVar4 = xe::xml::Writer::operator<<((Writer *)local_7d8,(BeginElement *)&local_8b8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,pcVar5,&local_8d9);
      de::FilePath::getBaseName_abi_cxx11_(&local_8d8,&local_7f8);
      xe::xml::Writer::Attribute::Attribute((Attribute *)local_658,"FileName",&local_8d8);
      xe::xml::Writer::operator<<(pWVar4,(Attribute *)local_658);
      if ((undefined1 *)local_648._16_8_ != local_648 + 0x20) {
        operator_delete((void *)local_648._16_8_,local_648._32_8_ + 1);
      }
      if ((pointer)local_658._0_8_ != (pointer)local_648) {
        operator_delete((void *)local_658._0_8_,(ulong)(local_648._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
        operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8.m_path._M_dataplus._M_p != &local_7f8.m_path.field_2) {
        operator_delete(local_7f8.m_path._M_dataplus._M_p,
                        local_7f8.m_path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8b8.name._M_dataplus._M_p != &local_8b8.name.field_2) {
        operator_delete(local_8b8.name._M_dataplus._M_p,
                        CONCAT17(local_8b8.name.field_2._M_local_buf[7],
                                 local_8b8.name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      parseBatchResult((TestLogParser *)local_1a0,pcVar5);
      local_648._0_8_ = (pointer)0x6f54746c75736552;
      local_648._8_4_ = 0x736c6174;
      local_658._8_8_ = (TestGroup *)0xc;
      local_648[0xc] = '\0';
      local_658._0_8_ = (pointer)local_648;
      xe::xml::Writer::operator<<((Writer *)local_7d8,(BeginElement *)local_658);
      if ((pointer)local_658._0_8_ != (pointer)local_648) {
        operator_delete((void *)local_658._0_8_,(ulong)(local_648._0_8_ + 1));
      }
      lVar9 = 0;
      iVar7 = 0;
      do {
        pcVar5 = xe::getTestStatusCodeName((TestStatusCode)lVar9);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
        std::ostream::operator<<
                  ((ostringstream *)local_658,
                   *(int *)((long)&local_878.
                                   super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar9 * 4));
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
        std::ios_base::~ios_base(local_5e8);
        xe::xml::Writer::Attribute::Attribute(&local_8b8,pcVar5,local_8d8._M_dataplus._M_p);
        xe::xml::Writer::operator<<((Writer *)local_7d8,&local_8b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8.value._M_dataplus._M_p != &local_8b8.value.field_2) {
          operator_delete(local_8b8.value._M_dataplus._M_p,
                          local_8b8.value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8.name._M_dataplus._M_p != &local_8b8.name.field_2) {
          operator_delete(local_8b8.name._M_dataplus._M_p,
                          CONCAT17(local_8b8.name.field_2._M_local_buf[7],
                                   local_8b8.name.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
          operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
        }
        iVar7 = iVar7 + *(int *)((long)&local_878.
                                        super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0xe);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
      std::ostream::operator<<(local_658,iVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
      std::ios_base::~ios_base(local_5e8);
      xe::xml::Writer::Attribute::Attribute(&local_8b8,"All",local_8d8._M_dataplus._M_p);
      pWVar4 = xe::xml::Writer::operator<<((Writer *)local_7d8,&local_8b8);
      xe::xml::Writer::operator<<(pWVar4,(EndElementType *)&xe::xml::Writer::EndElement);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8b8.value._M_dataplus._M_p != &local_8b8.value.field_2) {
        operator_delete(local_8b8.value._M_dataplus._M_p,
                        local_8b8.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8b8.name._M_dataplus._M_p != &local_8b8.name.field_2) {
        operator_delete(local_8b8.name._M_dataplus._M_p,
                        CONCAT17(local_8b8.name.field_2._M_local_buf[7],
                                 local_8b8.name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
        operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
      }
      xe::xml::Writer::operator<<
                ((Writer *)local_7d8,(EndElementType *)&xe::xml::Writer::EndElement);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\n",1);
      xe::TestLogParser::~TestLogParser((TestLogParser *)local_1a0);
      local_2e0._0_8_ = &PTR__ResultToSingleXmlLogHandler_00136b98;
      xe::TestResultParser::~TestResultParser((TestResultParser *)(local_2d0 + 8));
      xe::xml::Writer::~Writer((Writer *)local_7d8);
      local_4e0 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_4e0 + *(long *)(_VTT + -0x18)) = _memcpy;
      std::filebuf::~filebuf((filebuf *)&local_4d8);
      std::ios_base::~ios_base(local_3e8);
    }
    else {
      xe::TestRoot::TestRoot((TestRoot *)local_658);
      local_878.
      super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_878.
      super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_878.
      super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188 = (_Base_ptr)(local_1a0 + 8);
      local_1a0._8_4_ = _S_red;
      local_190._M_p = (pointer)0x0;
      local_180[0]._8_8_ = 0;
      local_180[0]._0_8_ = local_188;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4e0,__s,(allocator<char> *)local_7d8);
      bVar1 = de::FilePath::exists((FilePath *)local_4e0);
      if (local_4e0 != (undefined1  [8])local_4d0) {
        operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
      }
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4e0,__s,(allocator<char> *)local_7d8);
        TVar2 = de::FilePath::getType((FilePath *)local_4e0);
        if (local_4e0 != (undefined1  [8])local_4d0) {
          operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
        }
        if (TVar2 != TYPE_DIRECTORY) {
          pEVar6 = (Error *)__cxa_allocate_exception(0x10);
          xe::Error::Error(pEVar6,"Destination is not directory",
                           "de::FilePath(dstPath).getType() == de::FilePath::TYPE_DIRECTORY",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeBatchResultToXml.cpp"
                           ,0x158);
          __cxa_throw(pEVar6,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        de::createDirectoryAndParents(__s);
      }
      ResultToXmlFilesLogHandler::ResultToXmlFilesLogHandler
                ((ResultToXmlFilesLogHandler *)local_7d8,&local_878,__s);
      xe::TestLogParser::TestLogParser((TestLogParser *)local_4e0,(TestLogHandler *)local_7d8);
      parseBatchResult((TestLogParser *)local_4e0,pcVar5);
      xe::TestLogParser::~TestLogParser((TestLogParser *)local_4e0);
      local_7d8 = (undefined1  [8])&PTR__ResultToXmlFilesLogHandler_00136c50;
      xe::TestResultParser::~TestResultParser((TestResultParser *)local_7a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_allocated_capacity != &local_7b8) {
        operator_delete((void *)local_7c8._M_allocated_capacity,
                        (ulong)(local_7b8._M_allocated_capacity + 1));
      }
      xe::TestHierarchyBuilder::TestHierarchyBuilder
                ((TestHierarchyBuilder *)local_4e0,(TestRoot *)local_658);
      if (local_878.
          super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_878.
          super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pTVar8 = local_878.
                 super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_7d8 = (undefined1  [8])
                      xe::TestHierarchyBuilder::createCase
                                ((TestHierarchyBuilder *)local_4e0,
                                 (pTVar8->casePath)._M_dataplus._M_p,pTVar8->caseType);
          local_7d0 = pTVar8;
          std::
          _Rb_tree<xe::TestCase_const*,std::pair<xe::TestCase_const*const,xe::TestCaseResultHeader_const*>,std::_Select1st<std::pair<xe::TestCase_const*const,xe::TestCaseResultHeader_const*>>,std::less<xe::TestCase_const*>,std::allocator<std::pair<xe::TestCase_const*const,xe::TestCaseResultHeader_const*>>>
          ::_M_emplace_unique<std::pair<xe::TestCase*,xe::TestCaseResultHeader_const*>>
                    ((_Rb_tree<xe::TestCase_const*,std::pair<xe::TestCase_const*const,xe::TestCaseResultHeader_const*>,std::_Select1st<std::pair<xe::TestCase_const*const,xe::TestCaseResultHeader_const*>>,std::less<xe::TestCase_const*>,std::allocator<std::pair<xe::TestCase_const*const,xe::TestCaseResultHeader_const*>>>
                      *)local_1a0,
                     (pair<xe::TestCase_*,_const_xe::TestCaseResultHeader_*> *)local_7d8);
          pTVar8 = pTVar8 + 1;
        } while (pTVar8 != local_878.
                           super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      xe::TestHierarchyBuilder::~TestHierarchyBuilder((TestHierarchyBuilder *)local_4e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4e0,__s,(allocator<char> *)local_7d8);
      local_7c8._M_allocated_capacity = 0x7473696c65736163;
      local_7c8._8_4_ = 0x6c6d782e;
      local_7d0 = (pointer)0xc;
      local_7c8._M_local_buf[0xc] = '\0';
      local_7d8 = (undefined1  [8])&local_7c8;
      de::FilePath::join((FilePath *)&local_8b8,(FilePath *)local_4e0,(FilePath *)local_7d8);
      if (local_7d8 != (undefined1  [8])&local_7c8) {
        operator_delete((void *)local_7d8,(ulong)(local_7c8._M_allocated_capacity + 1));
      }
      if (local_4e0 != (undefined1  [8])local_4d0) {
        operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
      }
      std::ofstream::ofstream(local_4e0,local_8b8.name._M_dataplus._M_p,_S_trunc|_S_bin);
      xe::xml::Writer::Writer((Writer *)local_7d8,(ostream *)local_4e0);
      if (*(int *)((long)&local_4c0 + *(long *)((long)local_4e0 + -0x18)) != 0) {
        pEVar6 = (Error *)__cxa_allocate_exception(0x10);
        xe::Error::Error(pEVar6,"Failed to open caselist.xml","out.good()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeBatchResultToXml.cpp"
                         ,0x173);
        __cxa_throw(pEVar6,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4e0,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4e0,"<?xml-stylesheet href=\"",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"caselist.xsl",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4e0,"\" type=\"text/xsl\"?>\n",0x14);
      local_2d0._0_8_ =
           (vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
           0x746f6f5274736554;
      local_2e0._8_8_ = (Writer *)0x8;
      local_2d0[8] = '\0';
      local_2e0._0_8_ = local_2d0;
      xe::xml::Writer::operator<<((Writer *)local_7d8,(BeginElement *)local_2e0);
      if ((undefined1 *)local_2e0._0_8_ != local_2d0) {
        operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._0_8_ + 1));
      }
      if (0 < (int)((ulong)((long)local_5f8 - (long)local_600) >> 3)) {
        lVar9 = 0;
        do {
          writeTestCaseListNode
                    (local_600[lVar9],(ShortTestResultMap *)local_1a0,(Writer *)local_7d8);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (int)((ulong)((long)local_5f8 - (long)local_600) >> 3));
      }
      xe::xml::Writer::operator<<
                ((Writer *)local_7d8,(EndElementType *)&xe::xml::Writer::EndElement);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\n",1);
      xe::xml::Writer::~Writer((Writer *)local_7d8);
      local_4e0 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_4e0 + *(long *)(_VTT + -0x18)) = _memcpy;
      std::filebuf::~filebuf((filebuf *)&local_4d8);
      std::ios_base::~ios_base(local_3e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8b8.name._M_dataplus._M_p != &local_8b8.name.field_2) {
        operator_delete(local_8b8.name._M_dataplus._M_p,
                        CONCAT17(local_8b8.name.field_2._M_local_buf[7],
                                 local_8b8.name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      std::
      _Rb_tree<const_xe::TestCase_*,_std::pair<const_xe::TestCase_*const,_const_xe::TestCaseResultHeader_*>,_std::_Select1st<std::pair<const_xe::TestCase_*const,_const_xe::TestCaseResultHeader_*>_>,_std::less<const_xe::TestCase_*>,_std::allocator<std::pair<const_xe::TestCase_*const,_const_xe::TestCaseResultHeader_*>_>_>
      ::~_Rb_tree((_Rb_tree<const_xe::TestCase_*,_std::pair<const_xe::TestCase_*const,_const_xe::TestCaseResultHeader_*>,_std::_Select1st<std::pair<const_xe::TestCase_*const,_const_xe::TestCaseResultHeader_*>_>,_std::less<const_xe::TestCase_*>,_std::allocator<std::pair<const_xe::TestCase_*const,_const_xe::TestCaseResultHeader_*>_>_>
                   *)local_1a0);
      std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::~vector
                (&local_878);
      xe::TestGroup::~TestGroup((TestGroup *)local_658);
    }
    iVar7 = 0;
  }
  else {
    printf("%s: [options] [testlog] [destination path]\n",*argv);
    de::cmdline::detail::Parser::help((Parser *)local_658,(ostream *)&std::cout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_7a8);
    de::cmdline::detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_7d8);
    de::cmdline::detail::Parser::~Parser((Parser *)local_658);
    iVar7 = -1;
  }
  if (local_820 != &local_810) {
    operator_delete(local_820,CONCAT71(uStack_80f,local_810) + 1);
  }
  if (local_840 != &local_830) {
    operator_delete(local_840,CONCAT71(uStack_82f,local_830) + 1);
  }
  return iVar7;
}

Assistant:

int main (int argc, const char* const* argv)
{
	try
	{
		CommandLine cmdLine;
		if (!parseCommandLine(cmdLine, argc, argv))
			return -1;

		if (cmdLine.outputMode == OUTPUTMODE_SINGLE)
			batchResultToSingleXmlFile(cmdLine.batchResultFile.c_str(), cmdLine.outputPath.c_str());
		else
			batchResultToSeparateXmlFiles(cmdLine.batchResultFile.c_str(), cmdLine.outputPath.c_str());
	}
	catch (const std::exception& e)
	{
		printf("%s\n", e.what());
		return -1;
	}

	return 0;
}